

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O0

FieldMap * __thiscall FIX::FieldMap::operator=(FieldMap *this,FieldMap *rhs)

{
  bool bVar1;
  reference __k;
  mapped_type *this_00;
  FieldMap *this_01;
  FieldMap *local_60;
  reference local_58;
  FieldMap **group;
  const_iterator __end2;
  const_iterator __begin2;
  vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *__range2;
  pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_> *tagWithGroups;
  const_iterator __end1;
  const_iterator __begin1;
  Groups *__range1;
  FieldMap *rhs_local;
  FieldMap *this_local;
  
  clear(this);
  std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::operator=
            (&this->m_fields,&rhs->m_fields);
  message_order::operator=(&this->m_order,&rhs->m_order);
  __end1 = std::
           map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
           ::begin(&rhs->m_groups);
  tagWithGroups =
       (pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_> *)
       std::
       map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
       ::end(&rhs->m_groups);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&tagWithGroups);
    if (!bVar1) break;
    __k = std::
          _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
          ::operator*(&__end1);
    __end2 = std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::begin(&__k->second);
    group = (FieldMap **)
            std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::end(&__k->second);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                                  *)&group);
      if (!bVar1) break;
      local_58 = __gnu_cxx::
                 __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                 ::operator*(&__end2);
      this_00 = std::
                map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
                ::operator[](&this->m_groups,&__k->first);
      this_01 = (FieldMap *)operator_new(0x70);
      FieldMap(this_01,*local_58);
      local_60 = this_01;
      std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::push_back(this_00,&local_60);
      __gnu_cxx::
      __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
      ::operator++(&__end2);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
    ::operator++(&__end1);
  }
  return this;
}

Assistant:

FieldMap &FieldMap::operator=(const FieldMap &rhs) {
  clear();

  m_fields = rhs.m_fields;
  m_order = rhs.m_order;

  for (auto const &tagWithGroups : rhs.m_groups) {
    for (auto const &group : tagWithGroups.second) {
      m_groups[tagWithGroups.first].push_back(new FieldMap(*group));
    }
  }

  return *this;
}